

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
diligent_spirv_cross::CompilerGLSL::bitcast_glsl_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  bool bVar1;
  BaseType BVar2;
  BaseType BVar3;
  uint32_t uVar4;
  uint uVar5;
  BaseType BVar6;
  uint32_t uVar7;
  byte bVar8;
  BaseType BVar9;
  CompilerError *this_00;
  BaseType BVar10;
  BaseType BVar11;
  char *pcVar12;
  BaseType BVar13;
  BaseType BVar14;
  BaseType BVar15;
  BaseType BVar16;
  BaseType BVar17;
  allocator local_69;
  string local_68;
  BaseType local_44;
  BaseType local_40;
  BaseType local_3c;
  BaseType local_38;
  BaseType local_34;
  
  if ((out_type->pointer != false) || (in_type->pointer == true)) {
    if ((out_type->vecsize == 2) || (in_type->vecsize == 2)) {
      ::std::__cxx11::string::string((string *)&local_68,"GL_EXT_buffer_reference_uvec2",&local_69);
      require_extension_internal(this,&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
    }
LAB_0063d7ef:
    (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,out_type,0);
    return __return_storage_ptr__;
  }
  BVar2 = out_type->basetype;
  BVar3 = in_type->basetype;
  if (BVar2 != BVar3) {
    if (BVar2 == Boolean) {
      __assert_fail("out_type.basetype != SPIRType::Boolean",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x25a5,
                    "virtual string diligent_spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                   );
    }
    if (BVar3 == Boolean) {
      __assert_fail("in_type.basetype != SPIRType::Boolean",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x25a6,
                    "virtual string diligent_spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                   );
    }
    if ((BVar2 - SByte < 8) && (BVar3 - SByte < 8)) {
      bVar8 = 1;
      if (out_type->width == in_type->width) goto LAB_0063d7ef;
    }
    else {
      bVar8 = 0;
    }
    uVar4 = out_type->width;
    uVar5 = in_type->width;
    BVar6 = in_type->vecsize;
    if ((bool)(BVar6 == Void & 0xf < uVar5 & bVar8 & uVar4 == 8)) {
      pcVar12 = "unpack8";
      goto LAB_0063dd7c;
    }
    uVar7 = out_type->vecsize;
    if ((bool)(uVar7 == 1 & uVar5 == 8 & bVar8 & uVar4 == 0x10)) {
      pcVar12 = "pack16";
      goto LAB_0063dd7c;
    }
    if ((bool)(bVar8 & uVar5 == 8 & uVar4 == 0x20 & uVar7 == 1)) {
      pcVar12 = "pack32";
      goto LAB_0063dd7c;
    }
    BVar11 = BVar2 ^ UInt;
    if (BVar11 == Unknown && (BVar3 ^ Float) == Unknown) {
      bVar1 = (this->options).es;
      uVar5 = (this->options).version;
      if ((uVar5 < 300 & bVar1) == 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Float -> Uint bitcast not supported on legacy ESSL.");
LAB_0063ddb5:
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (bVar1 == false && uVar5 < 0x14a) {
        ::std::__cxx11::string::string((string *)&local_68,"GL_ARB_shader_bit_encoding",&local_69);
        require_extension_internal(this,&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
      }
      pcVar12 = "floatBitsToUint";
      goto LAB_0063dd7c;
    }
    if ((BVar3 ^ Float) == Unknown && (BVar2 ^ Int) == Unknown) {
      bVar1 = (this->options).es;
      uVar5 = (this->options).version;
      if ((uVar5 < 300 & bVar1) == 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Float -> Int bitcast not supported on legacy ESSL.");
        goto LAB_0063ddb5;
      }
      if (bVar1 == false && uVar5 < 0x14a) {
        ::std::__cxx11::string::string((string *)&local_68,"GL_ARB_shader_bit_encoding",&local_69);
        require_extension_internal(this,&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
      }
      pcVar12 = "floatBitsToInt";
      goto LAB_0063dd7c;
    }
    BVar13 = BVar3 ^ UInt;
    if ((BVar2 ^ Float) == Unknown && BVar13 == Unknown) {
      bVar1 = (this->options).es;
      uVar5 = (this->options).version;
      if ((uVar5 < 300 & bVar1) == 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Uint -> Float bitcast not supported on legacy ESSL.");
        goto LAB_0063ddb5;
      }
      if (bVar1 == false && uVar5 < 0x14a) {
        ::std::__cxx11::string::string((string *)&local_68,"GL_ARB_shader_bit_encoding",&local_69);
        require_extension_internal(this,&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
      }
      pcVar12 = "uintBitsToFloat";
      goto LAB_0063dd7c;
    }
    if ((BVar2 ^ Float) == Unknown && (BVar3 ^ Int) == Unknown) {
      bVar1 = (this->options).es;
      uVar5 = (this->options).version;
      if ((uVar5 < 300 & bVar1) == 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Int -> Float bitcast not supported on legacy ESSL.");
        goto LAB_0063ddb5;
      }
      if (bVar1 == false && uVar5 < 0x14a) {
        ::std::__cxx11::string::string((string *)&local_68,"GL_ARB_shader_bit_encoding",&local_69);
        require_extension_internal(this,&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
      }
      pcVar12 = "intBitsToFloat";
      goto LAB_0063dd7c;
    }
    if ((BVar2 ^ Int64) == Unknown && (BVar3 ^ Double) == Unknown) {
      pcVar12 = "doubleBitsToInt64";
      goto LAB_0063dd7c;
    }
    BVar14 = BVar2 ^ UInt64;
    if ((BVar3 ^ Double) == Unknown && BVar14 == Unknown) {
      pcVar12 = "doubleBitsToUint64";
      goto LAB_0063dd7c;
    }
    if ((BVar2 ^ Double) == Unknown && (BVar3 ^ Int64) == Unknown) {
      pcVar12 = "int64BitsToDouble";
      goto LAB_0063dd7c;
    }
    BVar16 = BVar3 ^ UInt64;
    if ((BVar2 ^ Double) == Unknown && BVar16 == Unknown) {
      pcVar12 = "uint64BitsToDouble";
      goto LAB_0063dd7c;
    }
    local_38 = BVar2 ^ Short;
    BVar17 = BVar3 ^ Half;
    if (local_38 == Unknown && BVar17 == Unknown) {
      pcVar12 = "float16BitsToInt16";
      goto LAB_0063dd7c;
    }
    local_3c = BVar2 ^ UShort;
    if (local_3c == Unknown && BVar17 == Unknown) {
      pcVar12 = "float16BitsToUint16";
      goto LAB_0063dd7c;
    }
    BVar10 = BVar2 ^ Half;
    local_40 = BVar3 ^ Short;
    if (BVar10 == Unknown && local_40 == Unknown) {
      pcVar12 = "int16BitsToFloat16";
      goto LAB_0063dd7c;
    }
    BVar9 = BVar3 ^ UShort;
    if (BVar10 == Unknown && BVar9 == Unknown) {
      pcVar12 = "uint16BitsToFloat16";
      goto LAB_0063dd7c;
    }
    local_44 = BVar6 ^ Boolean;
    local_34 = BVar14 | BVar13 | local_44;
    if (local_34 == Unknown) {
      pcVar12 = "packUint2x32";
      goto LAB_0063dd7c;
    }
    if (uVar7 == 2 && (BVar11 == Unknown && BVar16 == Unknown)) {
      pcVar12 = "unpackUint2x32";
      goto LAB_0063dd7c;
    }
    BVar15 = BVar6 ^ Void;
    if ((BVar10 == Unknown && BVar13 == Unknown) && BVar15 == Unknown) {
      pcVar12 = "unpackFloat2x16";
      goto LAB_0063dd7c;
    }
    if ((BVar17 == Unknown && BVar11 == Unknown) && local_44 == Unknown) {
      pcVar12 = "packFloat2x16";
      goto LAB_0063dd7c;
    }
    if (((BVar2 ^ Int) == Unknown && local_40 == Unknown) && local_44 == Unknown) {
      pcVar12 = "packInt2x16";
      goto LAB_0063dd7c;
    }
    if (((BVar3 ^ Int) == Unknown && local_38 == Unknown) && BVar15 == Unknown) {
      pcVar12 = "unpackInt2x16";
      goto LAB_0063dd7c;
    }
    if ((BVar11 == Unknown && BVar9 == Unknown) && local_44 == Unknown) {
      pcVar12 = "packUint2x16";
      goto LAB_0063dd7c;
    }
    if ((BVar13 == Unknown && local_3c == Unknown) && BVar15 == Unknown) {
      pcVar12 = "unpackUint2x16";
      goto LAB_0063dd7c;
    }
    if (((BVar2 ^ Int64) == Unknown && local_40 == Unknown) && (BVar6 ^ UByte) == Unknown) {
      pcVar12 = "packInt4x16";
      goto LAB_0063dd7c;
    }
    if ((local_38 == Unknown && (BVar3 ^ Int64) == Unknown) && BVar15 == Unknown) {
      pcVar12 = "unpackInt4x16";
      goto LAB_0063dd7c;
    }
    if ((BVar14 == Unknown && BVar9 == Unknown) && (BVar6 ^ UByte) == Unknown) {
      pcVar12 = "packUint4x16";
      goto LAB_0063dd7c;
    }
    if ((local_3c == Unknown && BVar16 == Unknown) && BVar15 == Unknown) {
      pcVar12 = "unpackUint4x16";
      goto LAB_0063dd7c;
    }
  }
  pcVar12 = "";
LAB_0063dd7c:
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar12,(allocator *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	// OpBitcast can deal with pointers.
	if (out_type.pointer || in_type.pointer)
	{
		if (out_type.vecsize == 2 || in_type.vecsize == 2)
			require_extension_internal("GL_EXT_buffer_reference_uvec2");
		return type_to_glsl(out_type);
	}

	if (out_type.basetype == in_type.basetype)
		return "";

	assert(out_type.basetype != SPIRType::Boolean);
	assert(in_type.basetype != SPIRType::Boolean);

	bool integral_cast = type_is_integral(out_type) && type_is_integral(in_type);
	bool same_size_cast = out_type.width == in_type.width;

	// Trivial bitcast case, casts between integers.
	if (integral_cast && same_size_cast)
		return type_to_glsl(out_type);

	// Catch-all 8-bit arithmetic casts (GL_EXT_shader_explicit_arithmetic_types).
	if (out_type.width == 8 && in_type.width >= 16 && integral_cast && in_type.vecsize == 1)
		return "unpack8";
	else if (in_type.width == 8 && out_type.width == 16 && integral_cast && out_type.vecsize == 1)
		return "pack16";
	else if (in_type.width == 8 && out_type.width == 32 && integral_cast && out_type.vecsize == 1)
		return "pack32";

	// Floating <-> Integer special casts. Just have to enumerate all cases. :(
	// 16-bit, 32-bit and 64-bit floats.
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Uint bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToUint";
	}
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Int bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToInt";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Uint -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "uintBitsToFloat";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Int -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "intBitsToFloat";
	}

	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToInt64";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToUint64";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "int64BitsToDouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "uint64BitsToDouble";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Half)
		return "float16BitsToInt16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
		return "float16BitsToUint16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::Short)
		return "int16BitsToFloat16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
		return "uint16BitsToFloat16";

	// And finally, some even more special purpose casts.
	if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UInt && in_type.vecsize == 2)
		return "packUint2x32";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UInt64 && out_type.vecsize == 2)
		return "unpackUint2x32";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackFloat2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
		return "packFloat2x16";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Short && in_type.vecsize == 2)
		return "packInt2x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int && in_type.vecsize == 1)
		return "unpackInt2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UShort && in_type.vecsize == 2)
		return "packUint2x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackUint2x16";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Short && in_type.vecsize == 4)
		return "packInt4x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int64 && in_type.vecsize == 1)
		return "unpackInt4x16";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UShort && in_type.vecsize == 4)
		return "packUint4x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt64 && in_type.vecsize == 1)
		return "unpackUint4x16";

	return "";
}